

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O3

int prf_array_find_ptr(void *id,void *elem)

{
  ulong uVar1;
  
  if (0xf < *(uint *)((long)id + -4)) {
    uVar1 = 0;
    do {
      if (*(void **)((long)id + uVar1 * 8) == elem) {
        return (int)uVar1;
      }
      uVar1 = uVar1 + 1;
    } while (*(uint *)((long)id + -4) >> 4 != uVar1);
  }
  return -1;
}

Assistant:

int 
prf_array_find_ptr(void *id, void *elem)
{
  int i,n;
  void **ptr;

  n = id_to_array(id)->numelem;
  ptr = (void**)id;

  for (i = 0; i < n; i++) if (ptr[i] == elem) return i;
  return -1;
}